

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

void __thiscall
slang::ast::DistExpression::serializeTo(DistExpression *this,ASTSerializer *serializer)

{
  DistWeight *weight;
  DistItem *item;
  pointer pDVar1;
  long lVar2;
  string_view name;
  string_view name_00;
  anon_class_8_1_79d3bf50 writeWeight;
  
  writeWeight.serializer = serializer;
  ASTSerializer::write(serializer,4,"left",(size_t)this->left_);
  name._M_str = "items";
  name._M_len = 5;
  ASTSerializer::startArray(serializer,name);
  pDVar1 = (this->items_)._M_ptr;
  weight = (DistWeight *)&pDVar1->weight;
  for (lVar2 = (this->items_)._M_extent._M_extent_value << 5; lVar2 != 0; lVar2 = lVar2 + -0x20) {
    ASTSerializer::startObject(serializer);
    ASTSerializer::write(serializer,5,"value",(size_t)pDVar1->value);
    if ((pDVar1->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged
        == true) {
      serializeTo::anon_class_8_1_79d3bf50::operator()(&writeWeight,weight);
    }
    ASTSerializer::endObject(serializer);
    pDVar1 = pDVar1 + 1;
    weight = weight + 2;
  }
  ASTSerializer::endArray(serializer);
  if ((this->defaultWeight_).
      super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged != false) {
    name_00._M_str = "defaultWeight";
    name_00._M_len = 0xd;
    ASTSerializer::writeProperty(serializer,name_00);
    ASTSerializer::startObject(serializer);
    serializeTo::anon_class_8_1_79d3bf50::operator()
              (&writeWeight,(DistWeight *)&this->defaultWeight_);
    ASTSerializer::endObject(serializer);
    return;
  }
  return;
}

Assistant:

void DistExpression::serializeTo(ASTSerializer& serializer) const {
    auto writeWeight = [&](const DistWeight& weight) {
        serializer.write("kind", weight.kind == DistWeight::PerRange ? "PerRange"sv : "PerValue"sv);
        serializer.write("weight", *weight.expr);
    };

    serializer.write("left", left());
    serializer.startArray("items");
    for (auto& item : items_) {
        serializer.startObject();
        serializer.write("value", item.value);
        if (item.weight)
            writeWeight(*item.weight);
        serializer.endObject();
    }
    serializer.endArray();

    if (defaultWeight_) {
        serializer.writeProperty("defaultWeight");
        serializer.startObject();
        writeWeight(*defaultWeight_);
        serializer.endObject();
    }
}